

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O3

Atomic * rw::Atomic::create(void)

{
  Atomic *object;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/clump.cpp line: 414"
  ;
  object = (Atomic *)(*Engine::memfuncs)((long)s_plglist,0x30014);
  if (object == (Atomic *)0x0) {
    create();
  }
  else {
    numAllocated = numAllocated + 1;
    (object->object).object.parent = (void *)0x0;
    object->geometry = (Geometry *)0x0;
    (object->boundingSphere).center.x = 0.0;
    (object->boundingSphere).center.y = 0.0;
    *(undefined8 *)&(object->boundingSphere).center.z = 0;
    (object->worldBoundingSphere).center.x = 0.0;
    (object->worldBoundingSphere).center.y = 0.0;
    *(undefined8 *)&(object->worldBoundingSphere).center.z = 0;
    object->clump = (Clump *)0x0;
    (object->inClump).next = (LLLink *)0x0;
    (object->inClump).prev = (LLLink *)0x0;
    object->pipeline = (ObjPipeline *)0x0;
    object->renderCB = defaultRenderCB;
    (object->object).object.type = '\x01';
    (object->object).object.subType = '\0';
    (object->object).object.flags = '\x05';
    (object->object).object.privateFlags = '\x01';
    object->world = (World *)0x0;
    object->originalSync = atomicSync;
    (object->object).syncCB = worldAtomicSync;
    PluginList::construct((PluginList *)&s_plglist,object);
  }
  return object;
}

Assistant:

Atomic*
Atomic::create(void)
{
	Atomic *atomic = (Atomic*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_ATOMIC);
	if(atomic == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	atomic->object.object.init(Atomic::ID, 0);
	atomic->object.syncCB = atomicSync;
	atomic->geometry = nil;
	atomic->boundingSphere.center.set(0.0f, 0.0f, 0.0f);
	atomic->boundingSphere.radius = 0.0f;
	atomic->worldBoundingSphere.center.set(0.0f, 0.0f, 0.0f);
	atomic->worldBoundingSphere.radius = 0.0f;
	atomic->setFrame(nil);
	atomic->object.object.privateFlags |= WORLDBOUNDDIRTY;
	atomic->clump = nil;
	atomic->inClump.init();
	atomic->pipeline = nil;
	atomic->renderCB = Atomic::defaultRenderCB;
	atomic->object.object.flags = Atomic::COLLISIONTEST | Atomic::RENDER;
	// TODO: interpolator

	// World extension
	atomic->world = nil;
	atomic->originalSync = atomic->object.syncCB;
	atomic->object.syncCB = worldAtomicSync;

	s_plglist.construct(atomic);
	return atomic;
}